

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigTrans.c
# Opt level: O0

Aig_Man_t *
Saig_ManTimeframeSimplify(Aig_Man_t *pAig,int nFrames,int nFramesMax,int fInit,int fVerbose)

{
  int iVar1;
  Aig_Man_t *pAVar2;
  abctime aVar3;
  Aig_Man_t *pAVar4;
  abctime aVar5;
  abctime clk;
  Aig_Man_t *pRes2;
  Aig_Man_t *pRes1;
  Aig_Man_t *pFraig;
  Aig_Man_t *pFrames;
  int fVerbose_local;
  int fInit_local;
  int nFramesMax_local;
  int nFrames_local;
  Aig_Man_t *pAig_local;
  
  pAVar2 = Saig_ManFramesNonInitial(pAig,nFrames);
  aVar3 = Abc_Clock();
  pAVar4 = Fra_FraigEquivence(pAVar2,1000,0);
  if (fVerbose != 0) {
    Aig_ManPrintStats(pAVar2);
    Aig_ManPrintStats(pAVar4);
    Abc_Print(1,"%s =","Fraiging");
    aVar5 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar5 - aVar3) * 1.0) / 1000000.0);
  }
  Aig_ManStop(pAVar4);
  if (pAVar2->pReprs == (Aig_Obj_t **)0x0) {
    __assert_fail("pFrames->pReprs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigTrans.c"
                  ,0x18c,"Aig_Man_t *Saig_ManTimeframeSimplify(Aig_Man_t *, int, int, int, int)");
  }
  Saig_ManCreateMapping(pAig,pAVar2,nFrames);
  Aig_ManStop(pAVar2);
  Saig_ManStopMap1(pAig);
  aVar3 = Abc_Clock();
  pAVar2 = Saig_ManFramesInitialMapped(pAig,nFrames,nFramesMax,fInit);
  Abc_Print(1,"%s =","Mapped");
  aVar5 = Abc_Clock();
  Abc_Print(1,"%9.2f sec\n",((double)(aVar5 - aVar3) * 1.0) / 1000000.0);
  Saig_ManStopMap2(pAig);
  aVar3 = Abc_Clock();
  pAVar4 = Saig_ManFramesInitialMapped(pAig,nFrames,nFramesMax,fInit);
  Abc_Print(1,"%s =","Normal");
  aVar5 = Abc_Clock();
  Abc_Print(1,"%9.2f sec\n",((double)(aVar5 - aVar3) * 1.0) / 1000000.0);
  if (fVerbose != 0) {
    Aig_ManPrintStats(pAVar4);
    Aig_ManPrintStats(pAVar2);
  }
  Aig_ManStop(pAVar4);
  iVar1 = Saig_ManHasMap1(pAig);
  if (iVar1 == 0) {
    iVar1 = Saig_ManHasMap2(pAig);
    if (iVar1 == 0) {
      return pAVar2;
    }
    __assert_fail("!Saig_ManHasMap2(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigTrans.c"
                  ,0x1a2,"Aig_Man_t *Saig_ManTimeframeSimplify(Aig_Man_t *, int, int, int, int)");
  }
  __assert_fail("!Saig_ManHasMap1(pAig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigTrans.c"
                ,0x1a1,"Aig_Man_t *Saig_ManTimeframeSimplify(Aig_Man_t *, int, int, int, int)");
}

Assistant:

Aig_Man_t * Saig_ManTimeframeSimplify( Aig_Man_t * pAig, int nFrames, int nFramesMax, int fInit, int fVerbose )
{
//    extern Aig_Man_t * Fra_FraigEquivence( Aig_Man_t * pManAig, int nConfMax, int fProve );
    Aig_Man_t * pFrames, * pFraig, * pRes1, * pRes2;
    abctime clk;
    // create uninitialized timeframes with map1
    pFrames = Saig_ManFramesNonInitial( pAig, nFrames );
    // perform fraiging for the unrolled timeframes
clk = Abc_Clock();
    pFraig = Fra_FraigEquivence( pFrames, 1000, 0 );
    // report the results
    if ( fVerbose )
    {
        Aig_ManPrintStats( pFrames );
        Aig_ManPrintStats( pFraig );
ABC_PRT( "Fraiging", Abc_Clock() - clk );
    }
    Aig_ManStop( pFraig );
    assert( pFrames->pReprs != NULL );
    // create AIG with map2
    Saig_ManCreateMapping( pAig, pFrames, nFrames );
    Aig_ManStop( pFrames );
    Saig_ManStopMap1( pAig );
    // create reduced initialized timeframes
clk = Abc_Clock();
    pRes2 = Saig_ManFramesInitialMapped( pAig, nFrames, nFramesMax, fInit );
ABC_PRT( "Mapped", Abc_Clock() - clk );
    // free mapping
    Saig_ManStopMap2( pAig );
clk = Abc_Clock();
    pRes1 = Saig_ManFramesInitialMapped( pAig, nFrames, nFramesMax, fInit );
ABC_PRT( "Normal", Abc_Clock() - clk );
    // report the results
    if ( fVerbose )
    {
        Aig_ManPrintStats( pRes1 );
        Aig_ManPrintStats( pRes2 );
    }
    Aig_ManStop( pRes1 );
    assert( !Saig_ManHasMap1(pAig) );
    assert( !Saig_ManHasMap2(pAig) );
    return pRes2;
}